

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formatter.cpp
# Opt level: O2

bool __thiscall
jsonnet::internal::FixNewlines::shouldExpandBetween(FixNewlines *this,ArgParams *params)

{
  ArgParam *pAVar1;
  bool bVar2;
  int iVar3;
  Fodder *fodder;
  ArgParam *param;
  ArgParam *param_00;
  
  pAVar1 = (params->
           super__Vector_base<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  bVar2 = true;
  for (param_00 = (params->
                  super__Vector_base<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>
                  )._M_impl.super__Vector_impl_data._M_start; param_00 != pAVar1;
      param_00 = param_00 + 1) {
    if (!bVar2) {
      fodder = argParamOpenFodder(this,param_00);
      iVar3 = countNewlines(fodder);
      if (0 < iVar3) break;
    }
    bVar2 = false;
  }
  return param_00 != pAVar1;
}

Assistant:

bool shouldExpandBetween(ArgParams &params)
    {
        bool first = true;
        for (auto &param : params) {
            if (!first && countNewlines(argParamOpenFodder(param)) > 0) {
                return true;
            }
            first = false;
        }
        return false;
    }